

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

void ssh2_set_window(ssh2_channel *c,int newwin)

{
  uint uVar1;
  ssh2_connection_state *psVar2;
  int *ctx;
  PktOut *pPVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  if ((c->closes & 6) != 0) {
    return;
  }
  if (c->chan->initial_fixed_window_size == 0) {
    psVar2 = c->connlayer;
    uVar1 = (psVar2->ppl).remote_bugs;
    uVar4 = 0x4000;
    if ((uint)newwin < 0x4000) {
      uVar4 = newwin;
    }
    uVar6 = (ulong)uVar4;
    if ((uVar1 >> 8 & 1) == 0) {
      uVar6 = (ulong)(uint)newwin;
    }
    iVar5 = (int)uVar6;
    if (c->locwindow <= (int)(uVar6 >> 0x1f) + iVar5 >> 1) {
      if (((uVar1 >> 10 & 1) == 0) && (iVar5 == c->locmaxwin)) {
        ctx = (int *)safemalloc(1,4,0);
        *ctx = iVar5 - c->locwindow;
        pPVar3 = ssh2_chanreq_init(c,"winadj@putty.projects.tartarus.org",
                                   ssh2_handle_winadj_response,ctx);
        pq_base_push(&((psVar2->ppl).out_pq)->pqb,&pPVar3->qnode);
        if (c->throttle_state != UNTHROTTLED) {
          c->throttle_state = UNTHROTTLING;
        }
      }
      else {
        c->remlocwin = iVar5;
        c->throttle_state = THROTTLED;
      }
      pPVar3 = (*((psVar2->ppl).bpp)->vt->new_pktout)(0x5d);
      BinarySink_put_uint32(pPVar3->binarysink_,(ulong)c->remoteid);
      BinarySink_put_uint32(pPVar3->binarysink_,(long)iVar5 - (long)c->locwindow);
      pq_base_push(&((psVar2->ppl).out_pq)->pqb,&pPVar3->qnode);
      c->locwindow = iVar5;
    }
  }
  return;
}

Assistant:

static void ssh2_set_window(struct ssh2_channel *c, int newwin)
{
    struct ssh2_connection_state *s = c->connlayer;

    /*
     * Never send WINDOW_ADJUST for a channel that the remote side has
     * already sent EOF on; there's no point, since it won't be
     * sending any more data anyway. Ditto if _we've_ already sent
     * CLOSE.
     */
    if (c->closes & (CLOSES_RCVD_EOF | CLOSES_SENT_CLOSE))
        return;

    /*
     * If the client-side Channel is in an initial setup phase with a
     * fixed window size, e.g. for an X11 channel when we're still
     * waiting to see its initial auth and may yet hand it off to a
     * downstream, don't send any WINDOW_ADJUST either.
     */
    if (c->chan->initial_fixed_window_size)
        return;

    /*
     * If the remote end has a habit of ignoring maxpkt, limit the
     * window so that it has no choice (assuming it doesn't ignore the
     * window as well).
     */
    if ((s->ppl.remote_bugs & BUG_SSH2_MAXPKT) && newwin > OUR_V2_MAXPKT)
        newwin = OUR_V2_MAXPKT;

    /*
     * Only send a WINDOW_ADJUST if there's significantly more window
     * available than the other end thinks there is.  This saves us
     * sending a WINDOW_ADJUST for every character in a shell session.
     *
     * "Significant" is arbitrarily defined as half the window size.
     */
    if (newwin / 2 >= c->locwindow) {
        PktOut *pktout;
        unsigned *up;

        /*
         * In order to keep track of how much window the client
         * actually has available, we'd like it to acknowledge each
         * WINDOW_ADJUST.  We can't do that directly, so we accompany
         * it with a CHANNEL_REQUEST that has to be acknowledged.
         *
         * This is only necessary if we're opening the window wide.
         * If we're not, then throughput is being constrained by
         * something other than the maximum window size anyway.
         */
        if (newwin == c->locmaxwin &&
            !(s->ppl.remote_bugs & BUG_CHOKES_ON_WINADJ)) {
            up = snew(unsigned);
            *up = newwin - c->locwindow;
            pktout = ssh2_chanreq_init(c, "winadj@putty.projects.tartarus.org",
                                       ssh2_handle_winadj_response, up);
            pq_push(s->ppl.out_pq, pktout);

            if (c->throttle_state != UNTHROTTLED)
                c->throttle_state = UNTHROTTLING;
        } else {
            /* Pretend the WINDOW_ADJUST was acked immediately. */
            c->remlocwin = newwin;
            c->throttle_state = THROTTLED;
        }
        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_WINDOW_ADJUST);
        put_uint32(pktout, c->remoteid);
        put_uint32(pktout, newwin - c->locwindow);
        pq_push(s->ppl.out_pq, pktout);
        c->locwindow = newwin;
    }
}